

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bencode.hpp
# Opt level: O3

int libtorrent::aux::write_integer<char*,unsigned_long,void>(char **out,unsigned_long data)

{
  size_t sVar1;
  char *pcVar2;
  string_view sVar3;
  array<char,_21UL> buf;
  array<char,_21UL> local_1d;
  
  sVar3 = integer_to_str(&local_1d,data);
  if (sVar3._M_len != 0) {
    pcVar2 = *out;
    sVar1 = 0;
    do {
      *pcVar2 = sVar3._M_str[sVar1];
      pcVar2 = *out + 1;
      *out = pcVar2;
      sVar1 = sVar1 + 1;
    } while (sVar3._M_len != sVar1);
  }
  return (int)sVar3._M_len;
}

Assistant:

int write_integer(OutIt& out, In data)
	{
		entry::integer_type const val = entry::integer_type(data);
		TORRENT_ASSERT(data == In(val));
		// the stack allocated buffer for keeping the
		// decimal representation of the number can
		// not hold number bigger than this:
		static_assert(sizeof(entry::integer_type) <= 8, "64 bit integers required");
		static_assert(sizeof(data) <= sizeof(entry::integer_type), "input data too big, see entry::integer_type");
		std::array<char, 21> buf;
		auto const str = integer_to_str(buf, val);
		for (char const c : str)
		{
			*out = c;
			++out;
		}
		return static_cast<int>(str.size());
	}